

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O3

bool __thiscall ON_LayerPrivate::operator==(ON_LayerPrivate *this,ON_LayerPrivate *other)

{
  element_type *model_component;
  element_type *model_component_00;
  bool bVar1;
  ON_ModelComponentContentMark OStack_78;
  ON_ModelComponentContentMark local_50;
  
  if (this == other) {
    return true;
  }
  model_component =
       (this->m_custom_section_style).
       super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  model_component_00 =
       (other->m_custom_section_style).
       super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((model_component == (element_type *)0x0 && model_component_00 != (element_type *)0x0) ||
     (model_component != (element_type *)0x0 && model_component_00 == (element_type *)0x0)) {
LAB_004bd90e:
    bVar1 = false;
  }
  else {
    if (model_component_00 != (element_type *)0x0 && model_component != (element_type *)0x0) {
      ON_ModelComponentContentMark::ON_ModelComponentContentMark
                (&local_50,&model_component->super_ON_ModelComponent);
      ON_ModelComponentContentMark::ON_ModelComponentContentMark
                (&OStack_78,&model_component_00->super_ON_ModelComponent);
      bVar1 = ::operator!=(&local_50,&OStack_78);
      if (bVar1) goto LAB_004bd90e;
    }
    bVar1 = this->m_visible_in_new_details == other->m_visible_in_new_details;
  }
  return bVar1;
}

Assistant:

bool ON_LayerPrivate::operator==(const ON_LayerPrivate& other) const
{
  if (this == &other)
    return true;

  {
    const ON_SectionStyle* customThis = m_custom_section_style.get();
    const ON_SectionStyle* customOther = other.m_custom_section_style.get();
    if (nullptr == customThis && customOther)
      return false;
    if (customThis && nullptr == customOther)
      return false;
    if (customThis && customOther)
    {
      if ((*customThis) != (*customOther))
        return false;
    }
  }

  if (m_visible_in_new_details != other.m_visible_in_new_details)
    return false;

  return true;
}